

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall Assimp::IFC::Schema_2x3::IfcTypeProduct::~IfcTypeProduct(IfcTypeProduct *this)

{
  undefined1 *puVar1;
  undefined1 *puVar2;
  void *pvVar3;
  
  *(undefined8 *)&this[-1].super_IfcTypeObject.field_0x70 = 0x8f55b8;
  *(undefined8 *)&(this->super_IfcTypeObject).field_0x58 = 0x8f5658;
  *(undefined8 *)&this[-1].super_IfcTypeObject.field_0xf8 = 0x8f55e0;
  *(undefined8 *)&this[-1].field_0x108 = 0x8f5608;
  *(undefined8 *)&this->super_IfcTypeObject = 0x8f5630;
  puVar2 = *(undefined1 **)&(this->super_IfcTypeObject).field_0x30;
  puVar1 = &(this->super_IfcTypeObject).field_0x40;
  if (puVar2 != puVar1) {
    operator_delete(puVar2,*(long *)puVar1 + 1);
  }
  puVar1 = &this[-1].super_IfcTypeObject.field_0x70;
  pvVar3 = *(void **)&(this->super_IfcTypeObject).field_0x10;
  if (pvVar3 != (void *)0x0) {
    operator_delete(pvVar3,*(long *)&(this->super_IfcTypeObject).field_0x20 - (long)pvVar3);
  }
  IfcTypeObject::~IfcTypeObject((IfcTypeObject *)puVar1,&PTR_construction_vtable_24__008f5670);
  operator_delete(puVar1,0x160);
  return;
}

Assistant:

IfcTypeProduct() : Object("IfcTypeProduct") {}